

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_group_ops(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  Allocator *pAVar6;
  int *piVar7;
  long *plVar8;
  ulong uVar9;
  int iVar10;
  Layer *pLVar11;
  long lVar12;
  size_t sVar13;
  int iVar14;
  void *in_R8;
  int i;
  uint uVar15;
  long lVar16;
  void *pvVar17;
  int i_00;
  bool bVar18;
  Mat local_288;
  undefined1 auStack_240 [12];
  int local_234;
  int local_230;
  int local_22c;
  Mat local_228;
  void *local_1e0;
  int *piStack_1d8;
  size_t local_1d0;
  int local_1c8;
  Allocator *local_1c0;
  uint local_1b8;
  int iStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  size_t local_1a0;
  void *local_198;
  int *piStack_190;
  size_t local_188;
  int local_180;
  Allocator *local_178;
  uint local_170;
  int iStack_16c;
  uint uStack_168;
  int iStack_164;
  int local_160;
  size_t local_158;
  void *local_150;
  int *piStack_148;
  size_t sStack_140;
  int iStack_138;
  Allocator *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined8 local_110;
  void *local_108;
  int *piStack_100;
  size_t sStack_f8;
  int iStack_f0;
  Allocator *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c0;
  size_t local_b8;
  Allocator *local_b0;
  Mat local_a8;
  size_t local_60;
  Option *local_58;
  Mat *local_50;
  size_t local_48;
  ParamDict pd;
  
  iVar10 = (this->super_ConvolutionDepthWise).num_output;
  iVar14 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar2 = (this->super_ConvolutionDepthWise).group;
  uVar9 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar2;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar14;
  local_c0 = &this->group_ops;
  lVar16 = 0;
  local_58 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar16) break;
    if (ppLVar4[lVar16] != (Layer *)0x0) {
      (*ppLVar4[lVar16]->_vptr_Layer[1])();
    }
    lVar16 = lVar16 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar3 = (this->super_ConvolutionDepthWise).group;
  i_00 = (this->super_ConvolutionDepthWise).num_output / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c0,(long)iVar3);
  local_22c = (((int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)(iVar10 / iVar2)) * iVar2) / iVar3) * iVar14 * i_00;
  local_48 = (size_t)local_22c;
  local_60 = (size_t)i_00;
  local_50 = &(this->super_ConvolutionDepthWise).activation_params;
  for (lVar16 = 0; lVar16 < (this->super_ConvolutionDepthWise).group; lVar16 = lVar16 + 1) {
    local_228.elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
    local_228.data =
         (void *)(lVar16 * local_48 * local_228.elemsize +
                 (long)(this->super_ConvolutionDepthWise).weight_data.data);
    local_228.elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
    local_228.allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
    local_228.refcount = (int *)0x0;
    local_228.c = 1;
    local_228.w = (int)local_48;
    local_228.dims = 1;
    local_228.h = 1;
    local_228.d = 1;
    local_228.cstep = local_48;
    Mat::clone(&local_a8,(__fn *)&local_228,(void *)0x0,1,in_R8);
    if (local_228.refcount != (int *)0x0) {
      LOCK();
      *local_228.refcount = *local_228.refcount + -1;
      UNLOCK();
      if (*local_228.refcount == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          free(local_228.data);
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    bVar18 = (this->super_ConvolutionDepthWise).bias_term == 0;
    if (bVar18) {
      pvVar17 = (void *)0x0;
      sVar13 = 0;
      local_230 = 0;
      local_b0 = (Allocator *)0x0;
      local_234 = 0;
      local_b8 = 0;
    }
    else {
      sVar13 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
      pvVar17 = (void *)(lVar16 * local_60 * sVar13 +
                        (long)(this->super_ConvolutionDepthWise).bias_data.data);
      local_230 = (this->super_ConvolutionDepthWise).bias_data.elempack;
      local_b0 = (this->super_ConvolutionDepthWise).bias_data.allocator;
      local_b8 = local_60;
      local_234 = i_00;
    }
    uVar15 = (uint)!bVar18;
    pLVar11 = create_layer_cpu(6);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,(this->super_ConvolutionDepthWise).kernel_w);
    ParamDict::set(&pd,0xb,(this->super_ConvolutionDepthWise).kernel_h);
    ParamDict::set(&pd,2,(this->super_ConvolutionDepthWise).dilation_w);
    ParamDict::set(&pd,0xc,(this->super_ConvolutionDepthWise).dilation_h);
    ParamDict::set(&pd,3,(this->super_ConvolutionDepthWise).stride_w);
    ParamDict::set(&pd,0xd,(this->super_ConvolutionDepthWise).stride_h);
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,5,(this->super_ConvolutionDepthWise).bias_term);
    ParamDict::set(&pd,6,local_22c);
    ParamDict::set(&pd,8,(this->super_ConvolutionDepthWise).int8_scale_term);
    ParamDict::set(&pd,9,(this->super_ConvolutionDepthWise).activation_type);
    ParamDict::set(&pd,10,local_50);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    if ((this->super_ConvolutionDepthWise).bias_term == 0) {
      lVar12 = 0x40;
      do {
        *(undefined8 *)((long)&local_228.data + lVar12) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x28) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x20) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x1c) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x14) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -8) = 0;
        *(undefined8 *)(auStack_240 + lVar12) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_234 + lVar12) = 0;
        lVar12 = lVar12 + 0x48;
      } while (lVar12 != 0x160);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.data = local_a8.data;
      local_228.refcount = local_a8.refcount;
      local_228.elemsize = local_a8.elemsize;
      local_228.elempack = local_a8.elempack;
      local_228.allocator = local_a8.allocator;
      local_228.c = local_a8.c;
      local_228.cstep = local_a8.cstep;
      if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
        local_288.cstep = 0;
        local_288.data = (void *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elemsize._4_4_ = 0;
        local_288.elempack = 0;
        local_288.h = 0;
        local_288.d = 0;
        local_288.c = 0;
        local_288.allocator = (Allocator *)0x0;
        local_288.dims = 0;
        local_288.w = 0;
        Mat::create(&local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data + lVar16 * 4
                 );
        iVar10 = local_288.c * (int)local_288.cstep;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
          *(undefined4 *)((long)local_288.data + lVar12 * 4) = uVar1;
        }
        piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
        if (piStack_1d8 != (int *)0x0) {
          LOCK();
          *piStack_1d8 = *piStack_1d8 + -1;
          UNLOCK();
          if (*piStack_1d8 == 0) {
            if (local_1c0 == (Allocator *)0x0) {
              free(local_1e0);
            }
            else {
              (*local_1c0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1d8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        local_1e0 = local_288.data;
        local_1d0 = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
        local_1c8 = local_288.elempack;
        local_1c0 = local_288.allocator;
        local_1b8 = local_288.dims;
        iStack_1b4 = local_288.w;
        uStack_1b0 = local_288.h;
        uStack_1ac = local_288.d;
        local_1a8 = local_288.c;
        local_1a0 = local_288.cstep;
        sVar13 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
        pvVar17 = (void *)(sVar13 * lVar16 +
                          (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
        iVar10 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
        pAVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
        if (piStack_190 != (int *)0x0) {
          LOCK();
          *piStack_190 = *piStack_190 + -1;
          UNLOCK();
          if (*piStack_190 == 0) {
            if (local_178 == (Allocator *)0x0) {
              free(local_198);
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
        piStack_190 = (int *)0x0;
        local_170 = 1;
        iStack_16c = 1;
        uStack_168 = 1;
        iStack_164 = 1;
        local_160 = 1;
        local_158 = 1;
        piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        local_198 = pvVar17;
        local_188 = sVar13;
        local_180 = iVar10;
        local_178 = pAVar6;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              free(local_288.data);
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar13 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar17 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar10 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (Allocator *)0x0) {
                free(local_150);
              }
              else {
                (*local_130->_vptr_Allocator[3])();
              }
            }
          }
          piStack_148 = (int *)0x0;
          local_128 = 0x100000001;
          uStack_120 = 0x100000001;
          local_118 = 1;
          local_110 = 1;
          local_150 = (void *)(sVar13 * lVar16 + (long)pvVar17);
          sStack_140 = sVar13;
          iStack_138 = iVar10;
          local_130 = pAVar6;
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
      lVar12 = 0xd8;
      do {
        piVar7 = *(int **)((long)&local_228.refcount + lVar12);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            plVar8 = *(long **)((long)&local_228.allocator + lVar12);
            if (plVar8 == (long *)0x0) {
              free(*(void **)((long)&local_228.data + lVar12));
            }
            else {
              (**(code **)(*plVar8 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_228.cstep + lVar12) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_228.elemsize + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_228.data + lVar12) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar12) = 0;
        *(undefined4 *)((long)&local_228.c + lVar12) = 0;
        *(undefined8 *)((long)&local_228.dims + lVar12) = 0;
        *(undefined8 *)((long)&local_228.h + lVar12) = 0;
        lVar12 = lVar12 + -0x48;
      } while (lVar12 != -0x48);
    }
    else {
      lVar12 = 0x40;
      do {
        *(undefined8 *)((long)&local_228.data + lVar12) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x28) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x20) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x1c) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -0x14) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + -8) = 0;
        *(undefined8 *)(auStack_240 + lVar12) = 0;
        *(undefined8 *)(auStack_240 + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_234 + lVar12) = 0;
        lVar12 = lVar12 + 0x48;
      } while (lVar12 != 0x1a8);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.data = local_a8.data;
      local_228.refcount = local_a8.refcount;
      local_228.elemsize = local_a8.elemsize;
      local_228.elempack = local_a8.elempack;
      local_228.allocator = local_a8.allocator;
      local_228.c = local_a8.c;
      local_228.cstep = local_a8.cstep;
      if (piStack_1d8 != (int *)0x0) {
        LOCK();
        *piStack_1d8 = *piStack_1d8 + -1;
        UNLOCK();
        if (*piStack_1d8 == 0) {
          if (local_1c0 == (Allocator *)0x0) {
            free(local_1e0);
          }
          else {
            (*local_1c0->_vptr_Allocator[3])();
          }
        }
      }
      piStack_1d8 = (int *)0x0;
      local_1c8 = local_230;
      local_1c0 = local_b0;
      iStack_1b4 = local_234;
      local_1a0 = local_b8;
      local_1e0 = pvVar17;
      local_1d0 = sVar13;
      local_1b8 = uVar15;
      uStack_1b0 = uVar15;
      uStack_1ac = uVar15;
      local_1a8 = uVar15;
      if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
        local_288.cstep = 0;
        local_288.data = (void *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elemsize._4_4_ = 0;
        local_288.elempack = 0;
        local_288.h = 0;
        local_288.d = 0;
        local_288.c = 0;
        local_288.allocator = (Allocator *)0x0;
        local_288.dims = 0;
        local_288.w = 0;
        Mat::create(&local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data + lVar16 * 4
                 );
        iVar10 = local_288.c * (int)local_288.cstep;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
          *(undefined4 *)((long)local_288.data + lVar12 * 4) = uVar1;
        }
        piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
        if (piStack_190 != (int *)0x0) {
          LOCK();
          *piStack_190 = *piStack_190 + -1;
          UNLOCK();
          if (*piStack_190 == 0) {
            if (local_178 == (Allocator *)0x0) {
              free(local_198);
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
        piStack_190 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        local_198 = local_288.data;
        local_188 = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
        local_180 = local_288.elempack;
        local_178 = local_288.allocator;
        local_170 = local_288.dims;
        iStack_16c = local_288.w;
        uStack_168 = local_288.h;
        iStack_164 = local_288.d;
        local_160 = local_288.c;
        local_158 = local_288.cstep;
        sVar13 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
        pvVar17 = (void *)(sVar13 * lVar16 +
                          (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
        iVar10 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
        pAVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
        if (piStack_148 != (int *)0x0) {
          LOCK();
          *piStack_148 = *piStack_148 + -1;
          UNLOCK();
          if (*piStack_148 == 0) {
            if (local_130 == (Allocator *)0x0) {
              free(local_150);
            }
            else {
              (*local_130->_vptr_Allocator[3])();
            }
          }
        }
        piStack_148 = (int *)0x0;
        local_128 = 0x100000001;
        uStack_120 = 0x100000001;
        local_118 = 1;
        local_110 = 1;
        piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        local_150 = pvVar17;
        sStack_140 = sVar13;
        iStack_138 = iVar10;
        local_130 = pAVar6;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              free(local_288.data);
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar13 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar17 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar10 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_100 != (int *)0x0) {
            LOCK();
            *piStack_100 = *piStack_100 + -1;
            UNLOCK();
            if (*piStack_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                free(local_108);
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          piStack_100 = (int *)0x0;
          local_e0 = 0x100000001;
          uStack_d8 = 0x100000001;
          local_d0 = 1;
          local_c8 = 1;
          local_108 = (void *)(sVar13 * lVar16 + (long)pvVar17);
          sStack_f8 = sVar13;
          iStack_f0 = iVar10;
          local_e8 = pAVar6;
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
      lVar12 = 0x120;
      do {
        piVar7 = *(int **)((long)&local_228.refcount + lVar12);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            plVar8 = *(long **)((long)&local_228.allocator + lVar12);
            if (plVar8 == (long *)0x0) {
              free(*(void **)((long)&local_228.data + lVar12));
            }
            else {
              (**(code **)(*plVar8 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_228.cstep + lVar12) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_228.elemsize + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_228.data + lVar12) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar12) = 0;
        *(undefined4 *)((long)&local_228.c + lVar12) = 0;
        *(undefined8 *)((long)&local_228.dims + lVar12) = 0;
        *(undefined8 *)((long)&local_228.h + lVar12) = 0;
        lVar12 = lVar12 + -0x48;
      } while (lVar12 != -0x48);
    }
    (*pLVar11->_vptr_Layer[4])(pLVar11,local_58);
    (local_c0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar16] = pLVar11;
    ParamDict::~ParamDict(&pd);
    if (local_a8.refcount != (int *)0x0) {
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}